

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O3

void __thiscall QMessageBox::setDetailedText(QMessageBox *this,QString *text)

{
  bool bVar1;
  QMessageBoxPrivate *this_00;
  QMessageBoxDetailsText *pQVar2;
  DetailButton *this_01;
  
  this_00 = *(QMessageBoxPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  pQVar2 = this_00->detailsText;
  if ((text->d).size == 0) {
    if (pQVar2 != (QMessageBoxDetailsText *)0x0) {
      QWidget::hide(&pQVar2->super_QWidget);
      QObject::deleteLater();
    }
    this_00->detailsText = (QMessageBoxDetailsText *)0x0;
    removeButton(this,(QAbstractButton *)this_00->detailsButton);
    if ((QWidget *)this_00->detailsButton != (QWidget *)0x0) {
      QWidget::hide((QWidget *)this_00->detailsButton);
      QObject::deleteLater();
    }
    this_00->detailsButton = (DetailButton *)0x0;
  }
  else {
    if (pQVar2 == (QMessageBoxDetailsText *)0x0) {
      pQVar2 = (QMessageBoxDetailsText *)operator_new(0x38);
      QMessageBoxDetailsText::QMessageBoxDetailsText(pQVar2,(QWidget *)this);
      this_00->detailsText = pQVar2;
      QWidget::hide((QWidget *)pQVar2);
    }
    if (this_00->detailsButton == (DetailButton *)0x0) {
      bVar1 = this_00->autoAddOkButton;
      this_01 = (DetailButton *)operator_new(0x28);
      DetailButton::DetailButton(this_01,(QWidget *)this);
      this_00->detailsButton = this_01;
      addButton(this,(QAbstractButton *)this_01,ActionRole);
      this_00->autoAddOkButton = bVar1;
    }
    QTextEdit::setPlainText(&this_00->detailsText->textEdit->super_QTextEdit,text);
  }
  QMessageBoxPrivate::setupLayout(this_00);
  return;
}

Assistant:

void QMessageBox::setDetailedText(const QString &text)
{
    Q_D(QMessageBox);
    if (text.isEmpty()) {
        if (d->detailsText) {
            d->detailsText->hide();
            d->detailsText->deleteLater();
        }
        d->detailsText = nullptr;
        removeButton(d->detailsButton);
        if (d->detailsButton) {
            d->detailsButton->hide();
            d->detailsButton->deleteLater();
        }
        d->detailsButton = nullptr;
    } else {
        if (!d->detailsText) {
            d->detailsText = new QMessageBoxDetailsText(this);
            d->detailsText->hide();
        }
        if (!d->detailsButton) {
            const bool autoAddOkButton = d->autoAddOkButton; // QTBUG-39334, addButton() clears the flag.
            d->detailsButton = new DetailButton(this);
            addButton(d->detailsButton, QMessageBox::ActionRole);
            d->autoAddOkButton = autoAddOkButton;
        }
        d->detailsText->setText(text);
    }
    d->setupLayout();
}